

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ElabSystemTaskSymbol::serializeTo(ElabSystemTaskSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  ASTSerializer *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string_view sVar3;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> msg;
  ElabSystemTaskSymbol *in_stack_00000220;
  ASTSerializer *this_00;
  int local_78;
  void *local_70;
  int local_58;
  void *local_50;
  size_t local_30;
  int local_20;
  void *local_18;
  
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)in_RSI);
  sVar3 = ast::toString(Fatal);
  local_30 = sVar3._M_len;
  ASTSerializer::write(this_00,local_20,local_18,local_30);
  getMessage(in_stack_00000220);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0xffa633);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)this_00)
    ;
    pbVar2 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                       ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0xffa661
                       );
    ASTSerializer::write(in_RSI,local_58,local_50,pbVar2->_M_len);
  }
  if (in_RDI[6]._M_len != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)this_00)
    ;
    ASTSerializer::write(in_RSI,local_78,local_70,in_RDI[6]._M_len);
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("taskKind", toString(taskKind));

    if (auto msg = getMessage())
        serializer.write("message", *msg);

    if (assertCondition)
        serializer.write("assertCondition", *assertCondition);
}